

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::repolish(QStyleSheetStyle *this,QApplication *app)

{
  long lVar1;
  QCoreApplication *objects;
  long in_FS_OFFSET;
  QList<const_QObject_*> allObjects;
  QHash<const_void_*,_QCss::StyleSheet> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<const_QObject_*,_QList<QCss::StyleRule>_>::keys
            ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)&DAT_aaaaaaaaaaaaaaaa);
  this_00 = &styleSheetCaches->styleSheetCache;
  objects = QCoreApplication::instance();
  QHash<const_void_*,_QCss::StyleSheet>::remove(this_00,&stack0xffffffffffffffd0);
  QHash<const_QObject_*,_QList<QCss::StyleRule>_>::clear
            ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)this_00);
  QHash<const_QObject_*,_QHash<int,_bool>_>::clear
            ((QHash<const_QObject_*,_QHash<int,_bool>_> *)this_00);
  QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::clear
            ((QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_> *)this_00
            );
  updateObjects((QList<const_QObject_*> *)objects);
  QList<const_QObject_*>::~QList((QList<const_QObject_*> *)0x42c8f2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::repolish(QApplication *app)
{
    Q_UNUSED(app);
    const QList<const QObject*> allObjects = styleSheetCaches->styleRulesCache.keys();
    styleSheetCaches->styleSheetCache.remove(qApp);
    styleSheetCaches->styleRulesCache.clear();
    styleSheetCaches->hasStyleRuleCache.clear();
    styleSheetCaches->renderRulesCache.clear();
    updateObjects(allObjects);
}